

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cpp
# Opt level: O1

size_t Corrade::Utility::Unicode::utf8(char32_t character,ArrayView4<char> result)

{
  byte bVar1;
  
  bVar1 = (byte)character;
  if ((uint)character < 0x80) {
    *result._data = bVar1;
    return 1;
  }
  if ((uint)character < 0x800) {
    *result._data = (byte)((uint)character >> 6) | 0xc0;
    result._data[1] = bVar1 & 0x3f | 0x80;
    return 2;
  }
  if ((uint)character < 0x10000) {
    *result._data = (byte)((uint)character >> 0xc) | 0xe0;
    result._data[1] = (byte)((uint)character >> 6) & 0x3f | 0x80;
    result._data[2] = bVar1 & 0x3f | 0x80;
    return 3;
  }
  if ((uint)character < 0x110000) {
    *result._data = (byte)((uint)character >> 0x12) | 0xf0;
    result._data[1] = (byte)((uint)character >> 0xc) & 0x3f | 0x80;
    result._data[2] = (byte)((uint)character >> 6) & 0x3f | 0x80;
    result._data[3] = bVar1 & 0x3f | 0x80;
    return 4;
  }
  return 0;
}

Assistant:

std::size_t utf8(const char32_t character, const Containers::ArrayView4<char> result) {
    if(character < U'\x00000080') {
        result[0] = 0x00 | ((character >>  0) & 0x7f);
        return 1;
    }

    if(character < U'\x00000800') {
        result[0] = 0xc0 | ((character >>  6) & 0x1f);
        result[1] = 0x80 | ((character >>  0) & 0x3f);
        return 2;
    }

    if(character < U'\x00010000') {
        result[0] = 0xe0 | ((character >> 12) & 0x0f);
        result[1] = 0x80 | ((character >>  6) & 0x3f);
        result[2] = 0x80 | ((character >>  0) & 0x3f);
        return 3;
    }

    if(character < U'\x00110000') {
        result[0] = 0xf0 | ((character >> 18) & 0x07);
        result[1] = 0x80 | ((character >> 12) & 0x3f);
        result[2] = 0x80 | ((character >>  6) & 0x3f);
        result[3] = 0x80 | ((character >>  0) & 0x3f);
        return 4;
    }

    /* Value outside of UTF-32 range */
    return 0;
}